

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbiw__outfile(stbi__write_context *s,int rgb_dir,int vdir,int x,int y,int comp,int expand_mono,
                  void *data,int alpha,int pad,char *fmt,...)

{
  char in_AL;
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  stbiw_uint32 zero;
  va_list v;
  void *local_138;
  undefined4 local_12c;
  ulong local_128;
  long local_120;
  long local_118;
  ulong local_110;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar5 = (undefined4)((ulong)_comp >> 0x20);
  iVar1 = (int)_comp;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if ((y | x) < 0) {
    iVar1 = 0;
  }
  else {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &stack0x00000030;
    local_108.gp_offset = 0x30;
    local_108.fp_offset = 0x30;
    iVar4 = iVar1;
    stbiw__writefv(s,fmt,&local_108);
    local_12c = 0;
    if (0 < y) {
      local_110 = (ulong)(y - 1);
      if (stbi__flip_vertically_on_write != 0) {
        local_110 = 0;
      }
      bVar6 = stbi__flip_vertically_on_write == 0;
      local_118 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
      local_128 = (ulong)(uint)x;
      local_120 = (long)x * (long)iVar1;
      local_138 = (void *)(local_120 * local_110 + (long)data);
      local_120 = local_120 * local_118;
      do {
        uVar2 = local_128;
        pvVar3 = local_138;
        if (0 < x) {
          do {
            stbiw__write_pixel(s,iVar1,alpha,expand_mono,(int)pvVar3,(uchar *)CONCAT44(uVar5,iVar4))
            ;
            uVar2 = uVar2 - 1;
            pvVar3 = (void *)((long)pvVar3 + (long)iVar1);
          } while (uVar2 != 0);
        }
        (*s->func)(s->context,&local_12c,pad);
        local_110 = local_110 + local_118;
        local_138 = (void *)((long)local_138 + local_120);
      } while ((-(uint)bVar6 | y) != (uint)local_110);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbiw__outfile(stbi__write_context *s, int rgb_dir, int vdir, int x,
                          int y, int comp, int expand_mono, void *data,
                          int alpha, int pad, const char *fmt, ...) {
  if (y < 0 || x < 0) {
    return 0;
  } else {
    va_list v;
    va_start(v, fmt);
    stbiw__writefv(s, fmt, v);
    va_end(v);
    stbiw__write_pixels(s, rgb_dir, vdir, x, y, comp, data, alpha, pad,
                        expand_mono);
    return 1;
  }
}